

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void ndiffstest2(void)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  double *x;
  int local_70c4;
  int d;
  int max_d;
  char *type;
  char *test;
  double alpha;
  double temp2 [1200];
  double temp1 [1200];
  double temp [1200];
  FILE *ifp;
  double *inp;
  int local_10;
  int N;
  int L;
  int i;
  
  __stream = fopen("../data/seriesB.txt","r");
  N = 0;
  if (__stream != (FILE *)0x0) {
    while (iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf %lf %lf \n",temp1 + (long)N + 0x4af,temp2 + (long)N + 0x4af,
                      temp2 + (long)N + -1);
      N = N + 1;
    }
    iVar1 = N - local_10;
    x = (double *)malloc((long)iVar1 << 3);
    for (N = 0; N < iVar1; N = N + 1) {
      x[N] = temp1[(long)N + 0x4af];
    }
    test = (char *)0x3fa999999999999a;
    type = "kpss";
    _d = "level";
    local_70c4 = 2;
    uVar2 = ndiffs(x,iVar1,(double *)&test,"kpss","level",&local_70c4);
    printf("d %d \n",(ulong)uVar2);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void ndiffstest2() {
	int i, L, N;
	double *inp;

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf %lf \n", &temp[i],&temp1[i],&temp2[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

	double alpha = 0.05;
	const char *test = "kpss";
	const char* type = "level";
	int max_d = 2;
	int d;

	d = ndiffs(inp,N,&alpha,test,type,&max_d);

	printf("d %d \n",d);
}